

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<Assimp::FIStringValue> __thiscall
Assimp::FIStringValue::create(FIStringValue *this,string *value)

{
  pointer pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<Assimp::FIStringValue> sVar2;
  
  pcVar1 = (pointer)operator_new(0x38);
  pcVar1[8] = '\x01';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\x01';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  *(undefined ***)pcVar1 = &PTR___Sp_counted_ptr_inplace_0095e6b8;
  *(pointer *)(pcVar1 + 0x18) = pcVar1 + 0x28;
  pcVar1[0x20] = '\0';
  pcVar1[0x21] = '\0';
  pcVar1[0x22] = '\0';
  pcVar1[0x23] = '\0';
  pcVar1[0x24] = '\0';
  pcVar1[0x25] = '\0';
  pcVar1[0x26] = '\0';
  pcVar1[0x27] = '\0';
  pcVar1[0x28] = '\0';
  *(undefined ***)(pcVar1 + 0x10) = &PTR_toString_abi_cxx11__0095e708;
  std::__cxx11::string::operator=((string *)(pcVar1 + 0x18),(string *)value);
  (this->super_FIValue)._vptr_FIValue = (_func_int **)(pcVar1 + 0x10);
  (this->value)._M_dataplus._M_p = pcVar1;
  sVar2.super___shared_ptr<Assimp::FIStringValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Assimp::FIStringValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIStringValue>)
         sVar2.super___shared_ptr<Assimp::FIStringValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIStringValue> FIStringValue::create(std::string &&value) {
    return std::make_shared<FIStringValueImpl>(std::move(value));
}